

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenEnumObjectBasedAPI(CppGenerator *this,EnumDef *enum_def)

{
  EnumDef *pEVar1;
  bool bVar2;
  EnumVal *pEVar3;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar4;
  reference ppEVar5;
  allocator<char> local_a01;
  string local_a00;
  allocator<char> local_9d9;
  string local_9d8;
  allocator<char> local_9b1;
  string local_9b0;
  allocator<char> local_989;
  string local_988;
  allocator<char> local_961;
  string local_960;
  allocator<char> local_939;
  string local_938;
  allocator<char> local_911;
  string local_910;
  allocator<char> local_8e9;
  string local_8e8;
  allocator<char> local_8c1;
  string local_8c0;
  allocator<char> local_899;
  string local_898;
  string local_878;
  allocator<char> local_851;
  string local_850;
  string local_830;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  undefined1 local_7c0 [8];
  string native_type;
  EnumVal *ev_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *__range2;
  string local_778;
  string local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  string local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  allocator<char> local_551;
  string local_550;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  string name;
  string local_148;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_128;
  EnumVal *local_120;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_110;
  const_iterator it;
  string local_100;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  EnumDef *local_18;
  EnumDef *enum_def_local;
  CppGenerator *this_local;
  
  if ((((this->opts_).super_IDLOptions.generate_object_based_api & 1U) != 0) &&
     ((enum_def->is_union & 1U) != 0)) {
    local_18 = enum_def;
    enum_def_local = (EnumDef *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"NAME",&local_39);
    Name_abi_cxx11_(&local_70,this,&local_18->super_Definition);
    CodeWriter::SetValue(&this->code_,&local_38,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    pEVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"NONE",&local_91);
    pEVar3 = EnumDef::Lookup(pEVar1,&local_90);
    if (pEVar3 == (EnumVal *)0x0) {
      __assert_fail("enum_def.Lookup(\"NONE\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                    ,0x561,
                    "void flatbuffers::cpp::CppGenerator::GenEnumObjectBasedAPI(const EnumDef &)");
    }
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"NONE",&local_b9);
    pEVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"NONE",(allocator<char> *)((long)&it._M_current + 7));
    pEVar3 = EnumDef::Lookup(pEVar1,&local_100);
    GetEnumValUse_abi_cxx11_(&local_e0,this,pEVar1,pEVar3);
    CodeWriter::SetValue(&this->code_,&local_b8,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    if ((local_18->uses_multiple_type_instances & 1U) == 0) {
      pvVar4 = EnumDef::Vals(local_18);
      local_110._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (pvVar4);
      while( true ) {
        pvVar4 = EnumDef::Vals(local_18);
        ev = (EnumVal *)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar4);
        bVar2 = __gnu_cxx::operator!=
                          (&local_110,
                           (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                            *)&ev);
        if (!bVar2) break;
        ppEVar5 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&local_110);
        local_120 = *ppEVar5;
        pvVar4 = EnumDef::Vals(local_18);
        local_128._M_current =
             (EnumVal **)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                       (pvVar4);
        bVar2 = __gnu_cxx::operator==(&local_110,&local_128);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_148,"template<typename T> struct {{NAME}}UnionTraits {",
                     (allocator<char> *)(name.field_2._M_local_buf + 0xf));
          CodeWriter::operator+=(&this->code_,&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
        }
        else {
          GetUnionElement_abi_cxx11_
                    ((string *)local_170,this,local_120,true,&(this->opts_).super_IDLOptions);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&value.field_2 + 8),"template<> struct {{NAME}}UnionTraits<",
                         (string *)local_170);
          std::operator+(&local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&value.field_2 + 8),"> {");
          CodeWriter::operator+=(&this->code_,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_170);
        }
        GetEnumValUse_abi_cxx11_((string *)local_1d0,this,local_18,local_120);
        std::operator+(&local_210,"  static const {{ENUM_NAME}} enum_value = ",(string *)local_1d0);
        std::operator+(&local_1f0,&local_210,";");
        CodeWriter::operator+=(&this->code_,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"};",&local_231);
        CodeWriter::operator+=(&this->code_,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::allocator<char>::~allocator(&local_231);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"",&local_259);
        CodeWriter::operator+=(&this->code_,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator(&local_259);
        std::__cxx11::string::~string((string *)local_1d0);
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
        ::operator++(&local_110);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"struct {{NAME}}Union {",&local_281);
    CodeWriter::operator+=(&this->code_,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"  {{NAME}} type;",&local_2a9);
    CodeWriter::operator+=(&this->code_,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"  void *value;",&local_2d1);
    CodeWriter::operator+=(&this->code_,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"",&local_2f9);
    CodeWriter::operator+=(&this->code_,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"  {{NAME}}Union() : type({{NONE}}), value(nullptr) {}",
               &local_321);
    CodeWriter::operator+=(&this->code_,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"  {{NAME}}Union({{NAME}}Union&& u) FLATBUFFERS_NOEXCEPT :",
               &local_349);
    CodeWriter::operator+=(&this->code_,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"    type({{NONE}}), value(nullptr)",&local_371);
    CodeWriter::operator+=(&this->code_,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"    { std::swap(type, u.type); std::swap(value, u.value); }",
               &local_399);
    CodeWriter::operator+=(&this->code_,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"  {{NAME}}Union(const {{NAME}}Union &);",&local_3c1);
    CodeWriter::operator+=(&this->code_,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"  {{NAME}}Union &operator=(const {{NAME}}Union &u)",&local_3e9)
    ;
    CodeWriter::operator+=(&this->code_,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,
               "    { {{NAME}}Union t(u); std::swap(type, t.type); std::swap(value, t.value); return *this; }"
               ,&local_411);
    CodeWriter::operator+=(&this->code_,&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,
               "  {{NAME}}Union &operator=({{NAME}}Union &&u) FLATBUFFERS_NOEXCEPT",&local_439);
    CodeWriter::operator+=(&this->code_,&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,
               "    { std::swap(type, u.type); std::swap(value, u.value); return *this; }",
               &local_461);
    CodeWriter::operator+=(&this->code_,&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator(&local_461);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,"  ~{{NAME}}Union() { Reset(); }",&local_489);
    CodeWriter::operator+=(&this->code_,&local_488);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator(&local_489);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"",&local_4b1);
    CodeWriter::operator+=(&this->code_,&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator(&local_4b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,"  void Reset();",&local_4d9);
    CodeWriter::operator+=(&this->code_,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"",&local_501);
    CodeWriter::operator+=(&this->code_,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator(&local_501);
    if ((local_18->uses_multiple_type_instances & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"  template <typename T>",&local_529);
      CodeWriter::operator+=(&this->code_,&local_528);
      std::__cxx11::string::~string((string *)&local_528);
      std::allocator<char>::~allocator(&local_529);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_550,"  void Set(T&& val) {",&local_551);
      CodeWriter::operator+=(&this->code_,&local_550);
      std::__cxx11::string::~string((string *)&local_550);
      std::allocator<char>::~allocator(&local_551);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_578,"    typedef typename std::remove_reference<T>::type RT;",
                 &local_579);
      CodeWriter::operator+=(&this->code_,&local_578);
      std::__cxx11::string::~string((string *)&local_578);
      std::allocator<char>::~allocator(&local_579);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a0,"    Reset();",&local_5a1);
      CodeWriter::operator+=(&this->code_,&local_5a0);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::allocator<char>::~allocator(&local_5a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c8,"    type = {{NAME}}UnionTraits<RT>::enum_value;",&local_5c9);
      CodeWriter::operator+=(&this->code_,&local_5c8);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::allocator<char>::~allocator(&local_5c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5f0,"    if (type != {{NONE}}) {",&local_5f1);
      CodeWriter::operator+=(&this->code_,&local_5f0);
      std::__cxx11::string::~string((string *)&local_5f0);
      std::allocator<char>::~allocator(&local_5f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_618,"      value = new RT(std::forward<T>(val));",&local_619);
      CodeWriter::operator+=(&this->code_,&local_618);
      std::__cxx11::string::~string((string *)&local_618);
      std::allocator<char>::~allocator(&local_619);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,"    }",&local_641);
      CodeWriter::operator+=(&this->code_,&local_640);
      std::__cxx11::string::~string((string *)&local_640);
      std::allocator<char>::~allocator(&local_641);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"  }",&local_669);
      CodeWriter::operator+=(&this->code_,&local_668);
      std::__cxx11::string::~string((string *)&local_668);
      std::allocator<char>::~allocator(&local_669);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"",&local_691);
      CodeWriter::operator+=(&this->code_,&local_690);
      std::__cxx11::string::~string((string *)&local_690);
      std::allocator<char>::~allocator(&local_691);
    }
    UnionUnPackSignature_abi_cxx11_(&local_6f8,this,local_18,true);
    std::operator+(&local_6d8,"  ",&local_6f8);
    std::operator+(&local_6b8,&local_6d8,";");
    CodeWriter::operator+=(&this->code_,&local_6b8);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::__cxx11::string::~string((string *)&local_6f8);
    UnionPackSignature_abi_cxx11_(&local_758,this,local_18,true);
    std::operator+(&local_738,"  ",&local_758);
    std::operator+(&local_718,&local_738,";");
    CodeWriter::operator+=(&this->code_,&local_718);
    std::__cxx11::string::~string((string *)&local_718);
    std::__cxx11::string::~string((string *)&local_738);
    std::__cxx11::string::~string((string *)&local_758);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_778,"",(allocator<char> *)((long)&__range2 + 7));
    CodeWriter::operator+=(&this->code_,&local_778);
    std::__cxx11::string::~string((string *)&local_778);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    pvVar4 = EnumDef::Vals(local_18);
    __end2 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                       (pvVar4);
    ev_1 = (EnumVal *)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar4)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                                       *)&ev_1), bVar2) {
      ppEVar5 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&__end2);
      native_type.field_2._8_8_ = *ppEVar5;
      bVar2 = EnumVal::IsZero((EnumVal *)native_type.field_2._8_8_);
      if (!bVar2) {
        GetUnionElement_abi_cxx11_
                  ((string *)local_7c0,this,(EnumVal *)native_type.field_2._8_8_,true,
                   &(this->opts_).super_IDLOptions);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e0,"NATIVE_TYPE",&local_7e1);
        CodeWriter::SetValue(&this->code_,&local_7e0,(string *)local_7c0);
        std::__cxx11::string::~string((string *)&local_7e0);
        std::allocator<char>::~allocator(&local_7e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_808,"NATIVE_NAME",&local_809);
        Name_abi_cxx11_(&local_830,this,(EnumVal *)native_type.field_2._8_8_);
        CodeWriter::SetValue(&this->code_,&local_808,&local_830);
        std::__cxx11::string::~string((string *)&local_830);
        std::__cxx11::string::~string((string *)&local_808);
        std::allocator<char>::~allocator(&local_809);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_850,"NATIVE_ID",&local_851);
        GetEnumValUse_abi_cxx11_(&local_878,this,local_18,(EnumVal *)native_type.field_2._8_8_);
        CodeWriter::SetValue(&this->code_,&local_850,&local_878);
        std::__cxx11::string::~string((string *)&local_878);
        std::__cxx11::string::~string((string *)&local_850);
        std::allocator<char>::~allocator(&local_851);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_898,"  {{NATIVE_TYPE}} *As{{NATIVE_NAME}}() {",&local_899);
        CodeWriter::operator+=(&this->code_,&local_898);
        std::__cxx11::string::~string((string *)&local_898);
        std::allocator<char>::~allocator(&local_899);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8c0,"    return type == {{NATIVE_ID}} ?",&local_8c1);
        CodeWriter::operator+=(&this->code_,&local_8c0);
        std::__cxx11::string::~string((string *)&local_8c0);
        std::allocator<char>::~allocator(&local_8c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8e8,
                   "      reinterpret_cast<{{NATIVE_TYPE}} *>(value) : nullptr;",&local_8e9);
        CodeWriter::operator+=(&this->code_,&local_8e8);
        std::__cxx11::string::~string((string *)&local_8e8);
        std::allocator<char>::~allocator(&local_8e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_910,"  }",&local_911);
        CodeWriter::operator+=(&this->code_,&local_910);
        std::__cxx11::string::~string((string *)&local_910);
        std::allocator<char>::~allocator(&local_911);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_938,"  const {{NATIVE_TYPE}} *As{{NATIVE_NAME}}() const {",
                   &local_939);
        CodeWriter::operator+=(&this->code_,&local_938);
        std::__cxx11::string::~string((string *)&local_938);
        std::allocator<char>::~allocator(&local_939);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_960,"    return type == {{NATIVE_ID}} ?",&local_961);
        CodeWriter::operator+=(&this->code_,&local_960);
        std::__cxx11::string::~string((string *)&local_960);
        std::allocator<char>::~allocator(&local_961);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_988,
                   "      reinterpret_cast<const {{NATIVE_TYPE}} *>(value) : nullptr;",&local_989);
        CodeWriter::operator+=(&this->code_,&local_988);
        std::__cxx11::string::~string((string *)&local_988);
        std::allocator<char>::~allocator(&local_989);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b0,"  }",&local_9b1);
        CodeWriter::operator+=(&this->code_,&local_9b0);
        std::__cxx11::string::~string((string *)&local_9b0);
        std::allocator<char>::~allocator(&local_9b1);
        std::__cxx11::string::~string((string *)local_7c0);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&__end2);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d8,"};",&local_9d9);
    CodeWriter::operator+=(&this->code_,&local_9d8);
    std::__cxx11::string::~string((string *)&local_9d8);
    std::allocator<char>::~allocator(&local_9d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a00,"",&local_a01);
    CodeWriter::operator+=(&this->code_,&local_a00);
    std::__cxx11::string::~string((string *)&local_a00);
    std::allocator<char>::~allocator(&local_a01);
    GenEnumEquals(this,local_18);
  }
  return;
}

Assistant:

void GenEnumObjectBasedAPI(const EnumDef &enum_def) {
    if (!(opts_.generate_object_based_api && enum_def.is_union)) { return; }
    code_.SetValue("NAME", Name(enum_def));
    FLATBUFFERS_ASSERT(enum_def.Lookup("NONE"));
    code_.SetValue("NONE", GetEnumValUse(enum_def, *enum_def.Lookup("NONE")));

    if (!enum_def.uses_multiple_type_instances) {
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        const auto &ev = **it;

        if (it == enum_def.Vals().begin()) {
          code_ += "template<typename T> struct {{NAME}}UnionTraits {";
        } else {
          auto name = GetUnionElement(ev, true, opts_);
          code_ += "template<> struct {{NAME}}UnionTraits<" + name + "> {";
        }

        auto value = GetEnumValUse(enum_def, ev);
        code_ += "  static const {{ENUM_NAME}} enum_value = " + value + ";";
        code_ += "};";
        code_ += "";
      }
    }

    code_ += "struct {{NAME}}Union {";
    code_ += "  {{NAME}} type;";
    code_ += "  void *value;";
    code_ += "";
    code_ += "  {{NAME}}Union() : type({{NONE}}), value(nullptr) {}";
    code_ += "  {{NAME}}Union({{NAME}}Union&& u) FLATBUFFERS_NOEXCEPT :";
    code_ += "    type({{NONE}}), value(nullptr)";
    code_ += "    { std::swap(type, u.type); std::swap(value, u.value); }";
    code_ += "  {{NAME}}Union(const {{NAME}}Union &);";
    code_ += "  {{NAME}}Union &operator=(const {{NAME}}Union &u)";
    code_ +=
        "    { {{NAME}}Union t(u); std::swap(type, t.type); std::swap(value, "
        "t.value); return *this; }";
    code_ +=
        "  {{NAME}}Union &operator=({{NAME}}Union &&u) FLATBUFFERS_NOEXCEPT";
    code_ +=
        "    { std::swap(type, u.type); std::swap(value, u.value); return "
        "*this; }";
    code_ += "  ~{{NAME}}Union() { Reset(); }";
    code_ += "";
    code_ += "  void Reset();";
    code_ += "";
    if (!enum_def.uses_multiple_type_instances) {
      code_ += "  template <typename T>";
      code_ += "  void Set(T&& val) {";
      code_ += "    typedef typename std::remove_reference<T>::type RT;";
      code_ += "    Reset();";
      code_ += "    type = {{NAME}}UnionTraits<RT>::enum_value;";
      code_ += "    if (type != {{NONE}}) {";
      code_ += "      value = new RT(std::forward<T>(val));";
      code_ += "    }";
      code_ += "  }";
      code_ += "";
    }
    code_ += "  " + UnionUnPackSignature(enum_def, true) + ";";
    code_ += "  " + UnionPackSignature(enum_def, true) + ";";
    code_ += "";

    for (const auto ev : enum_def.Vals()) {
      if (ev->IsZero()) { continue; }

      const auto native_type = GetUnionElement(*ev, true, opts_);
      code_.SetValue("NATIVE_TYPE", native_type);
      code_.SetValue("NATIVE_NAME", Name(*ev));
      code_.SetValue("NATIVE_ID", GetEnumValUse(enum_def, *ev));

      code_ += "  {{NATIVE_TYPE}} *As{{NATIVE_NAME}}() {";
      code_ += "    return type == {{NATIVE_ID}} ?";
      code_ += "      reinterpret_cast<{{NATIVE_TYPE}} *>(value) : nullptr;";
      code_ += "  }";

      code_ += "  const {{NATIVE_TYPE}} *As{{NATIVE_NAME}}() const {";
      code_ += "    return type == {{NATIVE_ID}} ?";
      code_ +=
          "      reinterpret_cast<const {{NATIVE_TYPE}} *>(value) : nullptr;";
      code_ += "  }";
    }
    code_ += "};";
    code_ += "";

    GenEnumEquals(enum_def);
  }